

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvref_common.c
# Opt level: O0

void scan_blk_mbmi(AV1_COMMON *cm,MACROBLOCKD *xd,int mi_row,int mi_col,MV_REFERENCE_FRAME *rf,
                  int row_offset,int col_offset,CANDIDATE_MV *ref_mv_stack,uint16_t *ref_mv_weight,
                  uint8_t *ref_match_count,uint8_t *newmv_count,int_mv *gm_mv_candidates,
                  uint8_t *refmv_count)

{
  int iVar1;
  int in_ECX;
  int in_EDX;
  uint16_t *in_RSI;
  int_mv *in_RDI;
  MB_MODE_INFO *in_R8;
  int in_R9D;
  WarpedMotionParams *unaff_retaddr;
  int in_stack_00000008;
  int len;
  MB_MODE_INFO *candidate;
  POSITION mi_pos;
  TileInfo *tile;
  undefined4 in_stack_ffffffffffffffb8;
  int iVar2;
  TileInfo *tile_00;
  undefined4 in_stack_ffffffffffffffd8;
  int iVar3;
  
  tile_00 = (TileInfo *)(in_RSI + 0xf50);
  iVar2 = in_stack_00000008;
  iVar3 = in_R9D;
  iVar1 = is_inside(tile_00,in_ECX,in_EDX,(POSITION *)&stack0xffffffffffffffc8);
  if (iVar1 != 0) {
    add_ref_mv_candidate
              (in_R8,(MV_REFERENCE_FRAME *)CONCAT44(iVar3,in_stack_ffffffffffffffd8),
               (uint8_t *)tile_00,(uint8_t *)CONCAT44(iVar2,in_R9D),
               *(uint8_t **)
                (*(long *)(in_RSI + 0xf5c) + (long)(in_R9D * *(int *)(in_RSI + 4) + iVar2) * 8),
               (CANDIDATE_MV *)CONCAT44(2,in_stack_ffffffffffffffb8),in_RSI,in_RDI,unaff_retaddr,
               (uint16_t)in_stack_00000008);
  }
  return;
}

Assistant:

static inline void scan_blk_mbmi(const AV1_COMMON *cm, const MACROBLOCKD *xd,
                                 const int mi_row, const int mi_col,
                                 const MV_REFERENCE_FRAME rf[2], int row_offset,
                                 int col_offset, CANDIDATE_MV *ref_mv_stack,
                                 uint16_t *ref_mv_weight,
                                 uint8_t *ref_match_count, uint8_t *newmv_count,
                                 int_mv *gm_mv_candidates,
                                 uint8_t *refmv_count) {
  const TileInfo *const tile = &xd->tile;
  POSITION mi_pos;

  mi_pos.row = row_offset;
  mi_pos.col = col_offset;

  if (is_inside(tile, mi_col, mi_row, &mi_pos)) {
    const MB_MODE_INFO *const candidate =
        xd->mi[mi_pos.row * xd->mi_stride + mi_pos.col];
    const int len = mi_size_wide[BLOCK_8X8];

    add_ref_mv_candidate(candidate, rf, refmv_count, ref_match_count,
                         newmv_count, ref_mv_stack, ref_mv_weight,
                         gm_mv_candidates, cm->global_motion, 2 * len);
  }  // Analyze a single 8x8 block motion information.
}